

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

MemoryAccess n_e_s::core::get_memory_access(Family family)

{
  logic_error *this;
  MemoryAccess local_c;
  Family family_local;
  
  switch(family) {
  case Invalid:
  case BRK:
  case PHP:
  case BPL:
  case CLC:
  case BIT:
  case PLP:
  case AND:
  case RTI:
  case JSR:
  case BMI:
  case SEC:
  case PHA:
  case JMP:
  case BVC:
  case CLI:
  case ADC:
  case PLA:
  case RTS:
  case BVS:
  case SEI:
  case TXS:
  case BCC:
  case LDX:
  case LDY:
  case LDA:
  case BCS:
  case CLV:
  case BNE:
  case CLD:
  case CPX:
  case NOP:
  case INX:
  case INY:
  case CMP:
  case CPY:
  case BEQ:
  case SED:
  case TYA:
  case TAY:
  case TAX:
  case TSX:
  case TXA:
  case DEY:
  case DEX:
  case EOR:
  case ORA:
  case SBC:
  case LAX:
    local_c = Read;
    break;
  case ASL:
  case INC:
  case LSR:
  case DEC:
  case ROL:
  case ROR:
  case DCP:
  case ISB:
  case SLO:
  case RLA:
  case SRE:
  case RRA:
    local_c = ReadWrite;
    break;
  case STY:
  case STA:
  case STX:
  case SAX:
    local_c = Write;
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unknown family");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_c;
}

Assistant:

MemoryAccess get_memory_access(const Family family) {
    switch (family) {
    // Return Read for instructions where memory access type has no meaning.
    // Set correct access type when we implement missing addressing modes.
    case Family::Invalid:
    case Family::BRK:
    case Family::PHP:
    case Family::BPL:
    case Family::CLC:
    case Family::BIT:
    case Family::PLP:
    case Family::AND:
    case Family::RTI:
    case Family::JSR:
    case Family::BMI:
    case Family::SEC:
    case Family::PHA:
    case Family::JMP:
    case Family::BVC:
    case Family::CLI:
    case Family::ADC:
    case Family::PLA:
    case Family::RTS:
    case Family::BVS:
    case Family::SEI:
    case Family::TXS:
    case Family::BCC:
    case Family::LDX:
    case Family::LDY:
    case Family::LDA:
    case Family::BCS:
    case Family::CLV:
    case Family::BNE:
    case Family::CLD:
    case Family::CPX:
    case Family::NOP:
    case Family::INX:
    case Family::INY:
    case Family::CPY:
    case Family::CMP:
    case Family::BEQ:
    case Family::SED:
    case Family::TYA:
    case Family::TAY:
    case Family::TAX:
    case Family::TSX:
    case Family::TXA:
    case Family::DEY:
    case Family::DEX:
    case Family::EOR:
    case Family::ORA:
    case Family::SBC:
    case Family::LAX:
        return MemoryAccess::Read;
    case Family::STY:
    case Family::STA:
    case Family::STX:
    case Family::SAX:
        return MemoryAccess::Write;
    case Family::INC:
    case Family::DEC:
    case Family::ROL:
    case Family::ROR:
    case Family::ASL:
    case Family::LSR:
    case Family::DCP:
    case Family::ISB:
    case Family::SLO:
    case Family::RLA:
    case Family::SRE:
    case Family::RRA:
        return MemoryAccess::ReadWrite;
    }
    // Should not happen
    throw std::logic_error("Unknown family"); // GCOVR_EXCL_LINE
}